

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
          (JavascriptPromiseAllResolveElementFunction *this,DynamicType *type)

{
  nullptr_t local_30;
  nullptr_t local_28;
  nullptr_t local_20;
  DynamicType *local_18;
  DynamicType *type_local;
  JavascriptPromiseAllResolveElementFunction *this_local;
  
  local_18 = type;
  type_local = (DynamicType *)this;
  RuntimeFunction::RuntimeFunction
            (&this->super_RuntimeFunction,type,
             (FunctionInfo *)JavascriptPromise::EntryInfo::AllResolveElementFunction);
  (this->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01e3ab18;
  local_20 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::WriteBarrierPtr
            (&this->capabilities,&local_20);
  this->index = 0;
  local_28 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>::
  WriteBarrierPtr(&this->remainingElementsWrapper,&local_28);
  local_30 = (nullptr_t)0x0;
  Memory::WriteBarrierPtr<Js::JavascriptArray>::WriteBarrierPtr(&this->values,&local_30);
  this->alreadyCalled = false;
  return;
}

Assistant:

JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction(DynamicType* type)
        : RuntimeFunction(type, &Js::JavascriptPromise::EntryInfo::AllResolveElementFunction), index(0), values(nullptr), capabilities(nullptr), remainingElementsWrapper(nullptr), alreadyCalled(false)
    { }